

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void __thiscall
duckdb::RLEScanState<double>::Skip
          (RLEScanState<double> *this,ColumnSegment *segment,idx_t skip_count)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  if (skip_count != 0) {
    pdVar1 = ((this->handle).node.ptr)->buffer;
    iVar2 = segment->offset;
    iVar3 = this->entry_pos;
    uVar4 = this->position_in_entry;
    do {
      uVar6 = (ulong)*(ushort *)(pdVar1 + iVar3 * 2 + this->rle_count_offset + iVar2);
      uVar5 = uVar6 - uVar4;
      if (skip_count < uVar5) {
        uVar5 = skip_count;
      }
      uVar4 = uVar4 + uVar5;
      if (uVar6 <= uVar4) {
        iVar3 = iVar3 + 1;
        this->entry_pos = iVar3;
        uVar4 = 0;
      }
      skip_count = skip_count - uVar5;
    } while (skip_count != 0);
    this->position_in_entry = uVar4;
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		auto data = handle.Ptr() + segment.GetBlockOffset();
		auto index_pointer = reinterpret_cast<rle_count_t *>(data + rle_count_offset);
		SkipInternal(index_pointer, skip_count);
	}